

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

SocketAddress * __thiscall
kj::anon_unknown_30::NetworkAddressImpl::chooseOneAddress(NetworkAddressImpl *this)

{
  uint uVar1;
  size_t sVar2;
  SocketAddress *pSVar3;
  Fault local_18;
  Fault f;
  NetworkAddressImpl *this_local;
  
  f.exception = (Exception *)this;
  sVar2 = Array<kj::(anonymous_namespace)::SocketAddress>::size(&this->addrs);
  if (sVar2 != 0) {
    uVar1 = this->counter;
    this->counter = uVar1 + 1;
    sVar2 = Array<kj::(anonymous_namespace)::SocketAddress>::size(&this->addrs);
    pSVar3 = Array<kj::(anonymous_namespace)::SocketAddress>::operator[]
                       (&this->addrs,(ulong)uVar1 % sVar2);
    return pSVar3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x4d0,FAILED,"addrs.size() > 0","\"No addresses available.\"",
             (char (*) [24])"No addresses available.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

const SocketAddress& chooseOneAddress() {
    KJ_REQUIRE(addrs.size() > 0, "No addresses available.");
    return addrs[counter++ % addrs.size()];
  }